

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_check_privkey(mbedtls_rsa_context *ctx)

{
  int iVar1;
  undefined1 local_158 [8];
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi L2;
  mbedtls_mpi L1;
  mbedtls_mpi G2;
  mbedtls_mpi G;
  mbedtls_mpi I;
  mbedtls_mpi H;
  mbedtls_mpi Q1;
  mbedtls_mpi P1;
  mbedtls_mpi DE;
  mbedtls_mpi PQ;
  int ret;
  mbedtls_rsa_context *ctx_local;
  
  ctx_local._4_4_ = mbedtls_rsa_check_pubkey(ctx);
  if (ctx_local._4_4_ == 0) {
    if ((((ctx->P).p == (mbedtls_mpi_uint *)0x0) || ((ctx->Q).p == (mbedtls_mpi_uint *)0x0)) ||
       ((ctx->D).p == (mbedtls_mpi_uint *)0x0)) {
      ctx_local._4_4_ = -0x4200;
    }
    else {
      mbedtls_mpi_init((mbedtls_mpi *)&DE.p);
      mbedtls_mpi_init((mbedtls_mpi *)&P1.p);
      mbedtls_mpi_init((mbedtls_mpi *)&Q1.p);
      mbedtls_mpi_init((mbedtls_mpi *)&H.p);
      mbedtls_mpi_init((mbedtls_mpi *)&I.p);
      mbedtls_mpi_init((mbedtls_mpi *)&G.p);
      mbedtls_mpi_init((mbedtls_mpi *)&G2.p);
      mbedtls_mpi_init((mbedtls_mpi *)&L1.p);
      mbedtls_mpi_init((mbedtls_mpi *)&L2.p);
      mbedtls_mpi_init((mbedtls_mpi *)&DP.p);
      mbedtls_mpi_init((mbedtls_mpi *)&DQ.p);
      mbedtls_mpi_init((mbedtls_mpi *)&QP.p);
      mbedtls_mpi_init((mbedtls_mpi *)local_158);
      PQ.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&DE.p,&ctx->P,&ctx->Q);
      if (((((PQ.p._4_4_ == 0) &&
            (PQ.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&P1.p,&ctx->D,&ctx->E), PQ.p._4_4_ == 0
            )) && ((PQ.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&Q1.p,&ctx->P,1),
                   PQ.p._4_4_ == 0 &&
                   ((PQ.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&H.p,&ctx->Q,1),
                    PQ.p._4_4_ == 0 &&
                    (PQ.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&I.p,(mbedtls_mpi *)&Q1.p,
                                                      (mbedtls_mpi *)&H.p), PQ.p._4_4_ == 0)))))) &&
          ((PQ.p._4_4_ = mbedtls_mpi_gcd((mbedtls_mpi *)&G2.p,&ctx->E,(mbedtls_mpi *)&I.p),
           PQ.p._4_4_ == 0 &&
           (((((PQ.p._4_4_ = mbedtls_mpi_gcd((mbedtls_mpi *)&L1.p,(mbedtls_mpi *)&Q1.p,
                                             (mbedtls_mpi *)&H.p), PQ.p._4_4_ == 0 &&
               (PQ.p._4_4_ = mbedtls_mpi_div_mpi((mbedtls_mpi *)&L2.p,(mbedtls_mpi *)&DP.p,
                                                 (mbedtls_mpi *)&I.p,(mbedtls_mpi *)&L1.p),
               PQ.p._4_4_ == 0)) &&
              (PQ.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&G.p,(mbedtls_mpi *)&P1.p,
                                                (mbedtls_mpi *)&L2.p), PQ.p._4_4_ == 0)) &&
             ((PQ.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&DQ.p,&ctx->D,(mbedtls_mpi *)&Q1.p),
              PQ.p._4_4_ == 0 &&
              (PQ.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&QP.p,&ctx->D,(mbedtls_mpi *)&H.p),
              PQ.p._4_4_ == 0)))) &&
            (PQ.p._4_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)local_158,&ctx->Q,&ctx->P),
            PQ.p._4_4_ == 0)))))) &&
         (((iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&DE.p,&ctx->N), iVar1 != 0 ||
           (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&DQ.p,&ctx->DP), iVar1 != 0)) ||
          ((iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&QP.p,&ctx->DQ), iVar1 != 0 ||
           ((((iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_158,&ctx->QP), iVar1 != 0 ||
              (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&DP.p,0), iVar1 != 0)) ||
             (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&G.p,1), iVar1 != 0)) ||
            (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&G2.p,1), iVar1 != 0)))))))) {
        PQ.p._4_4_ = -0x4200;
      }
      mbedtls_mpi_free((mbedtls_mpi *)&DE.p);
      mbedtls_mpi_free((mbedtls_mpi *)&P1.p);
      mbedtls_mpi_free((mbedtls_mpi *)&Q1.p);
      mbedtls_mpi_free((mbedtls_mpi *)&H.p);
      mbedtls_mpi_free((mbedtls_mpi *)&I.p);
      mbedtls_mpi_free((mbedtls_mpi *)&G.p);
      mbedtls_mpi_free((mbedtls_mpi *)&G2.p);
      mbedtls_mpi_free((mbedtls_mpi *)&L1.p);
      mbedtls_mpi_free((mbedtls_mpi *)&L2.p);
      mbedtls_mpi_free((mbedtls_mpi *)&DP.p);
      mbedtls_mpi_free((mbedtls_mpi *)&DQ.p);
      mbedtls_mpi_free((mbedtls_mpi *)&QP.p);
      mbedtls_mpi_free((mbedtls_mpi *)local_158);
      if (PQ.p._4_4_ == -0x4200) {
        ctx_local._4_4_ = PQ.p._4_4_;
      }
      else if (PQ.p._4_4_ == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = PQ.p._4_4_ + -0x4200;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_check_privkey( const mbedtls_rsa_context *ctx )
{
    int ret;
    mbedtls_mpi PQ, DE, P1, Q1, H, I, G, G2, L1, L2, DP, DQ, QP;

    if( ( ret = mbedtls_rsa_check_pubkey( ctx ) ) != 0 )
        return( ret );

    if( !ctx->P.p || !ctx->Q.p || !ctx->D.p )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    mbedtls_mpi_init( &PQ ); mbedtls_mpi_init( &DE ); mbedtls_mpi_init( &P1 ); mbedtls_mpi_init( &Q1 );
    mbedtls_mpi_init( &H  ); mbedtls_mpi_init( &I  ); mbedtls_mpi_init( &G  ); mbedtls_mpi_init( &G2 );
    mbedtls_mpi_init( &L1 ); mbedtls_mpi_init( &L2 ); mbedtls_mpi_init( &DP ); mbedtls_mpi_init( &DQ );
    mbedtls_mpi_init( &QP );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &PQ, &ctx->P, &ctx->Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &DE, &ctx->D, &ctx->E ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P1, &ctx->P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q1, &ctx->Q, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &P1, &Q1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, &ctx->E, &H  ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G2, &P1, &Q1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( &L1, &L2, &H, &G2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &I, &DE, &L1  ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &DP, &ctx->D, &P1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &DQ, &ctx->D, &Q1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &QP, &ctx->Q, &ctx->P ) );
    /*
     * Check for a valid PKCS1v2 private key
     */
    if( mbedtls_mpi_cmp_mpi( &PQ, &ctx->N ) != 0 ||
        mbedtls_mpi_cmp_mpi( &DP, &ctx->DP ) != 0 ||
        mbedtls_mpi_cmp_mpi( &DQ, &ctx->DQ ) != 0 ||
        mbedtls_mpi_cmp_mpi( &QP, &ctx->QP ) != 0 ||
        mbedtls_mpi_cmp_int( &L2, 0 ) != 0 ||
        mbedtls_mpi_cmp_int( &I, 1 ) != 0 ||
        mbedtls_mpi_cmp_int( &G, 1 ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

cleanup:
    mbedtls_mpi_free( &PQ ); mbedtls_mpi_free( &DE ); mbedtls_mpi_free( &P1 ); mbedtls_mpi_free( &Q1 );
    mbedtls_mpi_free( &H  ); mbedtls_mpi_free( &I  ); mbedtls_mpi_free( &G  ); mbedtls_mpi_free( &G2 );
    mbedtls_mpi_free( &L1 ); mbedtls_mpi_free( &L2 ); mbedtls_mpi_free( &DP ); mbedtls_mpi_free( &DQ );
    mbedtls_mpi_free( &QP );

    if( ret == MBEDTLS_ERR_RSA_KEY_CHECK_FAILED )
        return( ret );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED + ret );

    return( 0 );
}